

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O0

void __thiscall depspawn::internal::ThreadPool::ThreadPool(ThreadPool *this,int n)

{
  anon_class_1_0_00000001 *in_RDI;
  ThreadPool *unaff_retaddr;
  function<void_()> *in_stack_ffffffffffffffe0;
  anon_class_1_0_00000001 *paVar1;
  int new_nthreads;
  
  paVar1 = in_RDI;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x129f9c);
  new_nthreads = (int)((ulong)paVar1 >> 0x20);
  std::mutex::mutex((mutex *)0x129faa);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x40));
  std::function<void()>::
  function<depspawn::internal::ThreadPool::ThreadPool(int)::_lambda()_1_,void>
            (in_stack_ffffffffffffffe0,in_RDI);
  *(undefined4 *)(in_RDI + 0x94) = 0;
  in_RDI[0x98] = (anon_class_1_0_00000001)0x0;
  in_RDI[0x99] = (anon_class_1_0_00000001)0x0;
  resize(unaff_retaddr,new_nthreads);
  return;
}

Assistant:

ThreadPool(const int n = 0) :
  func_{[]{}}, count_{0}, ready_{false}, finish_{false}
  {
    resize(n);
  }